

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::subgroup_size_control_is_supported
          (Impl *this,VkPipelineShaderStageCreateInfo *stage)

{
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *pVVar1;
  bool bVar2;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *required;
  bool is_compute_like_stage;
  VkPipelineShaderStageCreateFlags supported_flags;
  VkPipelineShaderStageCreateInfo *stage_local;
  Impl *this_local;
  
  if ((stage->flags & 0xfffffffc) == 0) {
    if (((stage->flags & 1) == 0) ||
       ((this->features).subgroup_size_control.subgroupSizeControl != 0)) {
      bVar2 = true;
      if ((stage->stage != VK_SHADER_STAGE_MESH_BIT_EXT) &&
         (bVar2 = true, stage->stage != VK_SHADER_STAGE_TASK_BIT_EXT)) {
        bVar2 = stage->stage == VK_SHADER_STAGE_COMPUTE_BIT;
      }
      if (((stage->flags & 2) == 0) ||
         (((bVar2 && ((this->features).subgroup_size_control.computeFullSubgroups != 0)) &&
          ((this->features).subgroup_size_control.subgroupSizeControl != 0)))) {
        pVVar1 = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                           (VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO
                            ,stage->pNext);
        if ((pVVar1 == (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)0x0) ||
           ((((this->features).subgroup_size_control.subgroupSizeControl != 0 &&
             (((this->props).subgroup_size_control.requiredSubgroupSizeStages & stage->stage) != 0))
            && ((pVVar1->requiredSubgroupSize <= (this->props).subgroup_size_control.maxSubgroupSize
                && ((this->props).subgroup_size_control.minSubgroupSize <=
                    pVVar1->requiredSubgroupSize)))))) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::subgroup_size_control_is_supported(const VkPipelineShaderStageCreateInfo &stage) const
{
	constexpr VkPipelineShaderStageCreateFlags supported_flags =
			VK_PIPELINE_SHADER_STAGE_CREATE_ALLOW_VARYING_SUBGROUP_SIZE_BIT |
			VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT;

	if ((stage.flags & ~supported_flags) != 0)
		return false;

	if ((stage.flags & VK_PIPELINE_SHADER_STAGE_CREATE_ALLOW_VARYING_SUBGROUP_SIZE_BIT_EXT) != 0 &&
	    features.subgroup_size_control.subgroupSizeControl == VK_FALSE)
	{
		return false;
	}

	bool is_compute_like_stage =
			stage.stage == VK_SHADER_STAGE_MESH_BIT_EXT ||
			stage.stage == VK_SHADER_STAGE_TASK_BIT_EXT ||
			stage.stage == VK_SHADER_STAGE_COMPUTE_BIT;

	if ((stage.flags & VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT_EXT) != 0 &&
	    (!is_compute_like_stage ||
	     features.subgroup_size_control.computeFullSubgroups == VK_FALSE ||
	     features.subgroup_size_control.subgroupSizeControl == VK_FALSE))
	{
		return false;
	}

	auto *required = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT,
			stage.pNext);

	if (required)
	{
		if (features.subgroup_size_control.subgroupSizeControl == VK_FALSE ||
		    (props.subgroup_size_control.requiredSubgroupSizeStages & stage.stage) == 0 ||
		    required->requiredSubgroupSize > props.subgroup_size_control.maxSubgroupSize ||
		    required->requiredSubgroupSize < props.subgroup_size_control.minSubgroupSize)
		{
			return false;
		}
	}

	return true;
}